

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O2

Expression *
slang::ast::StringLiteral::fromSyntax(ASTContext *context,LiteralExpressionSyntax *syntax)

{
  Compilation *this;
  Diagnostic *pDVar1;
  Expression *pEVar2;
  ConstantValue *args_3;
  Type *args;
  StringLiteral *pSVar3;
  char *pcVar4;
  bitwidth_t bits;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *this_00;
  size_t sVar5;
  reverse_iterator<const_char_*> __end3;
  SourceRange sourceRange;
  SVInt local_b8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_a8;
  string_view value;
  SmallVector<std::byte,_40UL> bytes;
  
  value = parsing::Token::valueText(&syntax->literal);
  pcVar4 = value._M_str;
  sVar5 = value._M_len;
  this = ((context->scope).ptr)->compilation;
  if (sVar5 == 0) {
    bits = 8;
    SVInt::SVInt((SVInt *)&local_a8,8,0,false);
    std::
    variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
    ::variant<slang::SVInt,void,void,slang::SVInt,void>
              ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                *)&bytes,(SVInt *)&local_a8);
    args_3 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                       (&this->constantAllocator,(ConstantValue *)&bytes);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&bytes);
    SVInt::~SVInt((SVInt *)&local_a8);
  }
  else {
    bits = (int)value._M_len * 8;
    if (0xffffff < bits) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pDVar1 = ASTContext::addDiag(context,(DiagCode)0x1d0009,sourceRange);
      pDVar1 = Diagnostic::operator<<<unsigned_int>(pDVar1,bits);
      Diagnostic::operator<<<unsigned_int>(pDVar1,0xffffff);
      pEVar2 = Expression::badExpr(this,(Expression *)0x0);
      return pEVar2;
    }
    bytes.super_SmallVectorBase<std::byte>.len = 0;
    bytes.super_SmallVectorBase<std::byte>.data_ =
         (pointer)bytes.super_SmallVectorBase<std::byte>.firstElement;
    bytes.super_SmallVectorBase<std::byte>.cap = 0x28;
    for (; sVar5 != 0; sVar5 = sVar5 - 1) {
      local_a8._0_1_ = pcVar4[sVar5 - 1];
      SmallVectorBase<std::byte>::emplace_back<std::byte>
                (&bytes.super_SmallVectorBase<std::byte>,(byte *)&local_a8);
    }
    SVInt::SVInt(&local_b8,bits,
                 (span<const_std::byte,_18446744073709551615UL>)
                 bytes.super_SmallVectorBase<std::byte>._0_16_,false);
    this_00 = &local_a8;
    std::
    variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
    ::variant<slang::SVInt,void,void,slang::SVInt,void>
              ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                *)this_00,&local_b8);
    args_3 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                       (&this->constantAllocator,(ConstantValue *)this_00);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_a8);
    SVInt::~SVInt(&local_b8);
    SmallVectorBase<std::byte>::cleanup
              (&bytes.super_SmallVectorBase<std::byte>,(EVP_PKEY_CTX *)this_00);
  }
  args = Compilation::getType(this,bits,(bitmask<slang::ast::IntegralFlags>)0x0);
  bytes.super_SmallVectorBase<std::byte>._0_16_ = parsing::Token::rawText(&syntax->literal);
  local_a8._M_rest._0_16_ =
       (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pSVar3 = BumpAllocator::
           emplace<slang::ast::StringLiteral,slang::ast::Type_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue&,slang::SourceRange>
                     (&this->super_BumpAllocator,args,&value,
                      (basic_string_view<char,_std::char_traits<char>_> *)&bytes,args_3,
                      (SourceRange *)&local_a8);
  return &pSVar3->super_Expression;
}

Assistant:

Expression& StringLiteral::fromSyntax(const ASTContext& context,
                                      const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::StringLiteralExpression);

    std::string_view value = syntax.literal.valueText();
    bitwidth_t width;
    ConstantValue* intVal;

    auto& comp = context.getCompilation();
    if (value.empty()) {
        // [11.10.3] says that empty string literals take on a value of "\0" (8 zero bits).
        width = 8;
        intVal = comp.allocConstant(SVInt(8, 0, false));
    }
    else {
        width = bitwidth_t(value.size() * 8);
        if (width > (uint32_t)SVInt::MAX_BITS) {
            context.addDiag(diag::PackedTypeTooLarge, syntax.sourceRange())
                << width << (uint32_t)SVInt::MAX_BITS;
            return badExpr(comp, nullptr);
        }

        // String literals represented as integers put the first character on the
        // left, which translates to the msb, so we have to reverse the string.
        SmallVector<byte> bytes;
        for (char c : std::views::reverse(value))
            bytes.push_back((byte)c);

        intVal = comp.allocConstant(SVInt(width, bytes, false));
    }

    auto& type = comp.getType(width, IntegralFlags::Unsigned);
    return *comp.emplace<StringLiteral>(type, value, syntax.literal.rawText(), *intVal,
                                        syntax.sourceRange());
}